

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O2

void __thiscall
QGraphicsWidgetPrivate::windowFrameMouseReleaseEvent
          (QGraphicsWidgetPrivate *this,QGraphicsSceneMouseEvent *event)

{
  undefined1 *puVar1;
  WindowFrameSection WVar2;
  QGraphicsItem *pQVar3;
  WindowData *pWVar4;
  QMarginsF *pQVar5;
  char cVar6;
  int iVar7;
  QFlagsStorage<Qt::MouseButton> QVar8;
  QStyle *pQVar9;
  QWidget *pQVar10;
  QGraphicsItem *this_00;
  long in_FS_OFFSET;
  double dVar11;
  QRect QVar12;
  QPoint local_e0;
  undefined1 local_d8 [16];
  QRectF local_c8;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  Data *pDStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->super_QGraphicsItemPrivate).q_ptr;
  this_00 = pQVar3 + -1;
  if (pQVar3 == (QGraphicsItem *)0x0) {
    this_00 = (QGraphicsItem *)0x0;
  }
  ensureWindowData(this);
  pWVar4 = (this->windowData)._M_t.
           super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
           ._M_t.
           super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
           .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
  WVar2 = pWVar4->grabbedSection;
  if (WVar2 != NoSection) {
    if (WVar2 == TitleBarArea) {
      puVar1 = &pWVar4->field_0x20;
      *puVar1 = *puVar1 & 0xfd;
      local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pDStack_60 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)local_a8);
      initStyleOptionTitleBar(this,(QStyleOptionTitleBar *)local_a8);
      QGraphicsWidget::windowFrameRect(&local_c8,(QGraphicsWidget *)this_00);
      QVar12 = QRectF::toRect(&local_c8);
      uStack_90._4_4_ = QVar12.y2.m_i.m_i - QVar12.y1.m_i;
      uStack_90._0_4_ = QVar12.x2.m_i.m_i - QVar12.x1.m_i;
      local_98._0_4_ = 0;
      local_98._4_4_ = 0;
      pQVar9 = QGraphicsWidget::style((QGraphicsWidget *)this_00);
      iVar7 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1a,(QStyleOptionTitleBar *)local_a8,0);
      uStack_90._4_4_ = iVar7 + local_98._4_4_ + -1;
      local_c8._0_16_ = QGraphicsSceneMouseEvent::pos(event);
      dVar11 = local_c8.xp;
      pQVar5 = (this->windowFrameMargins)._M_t.
               super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
               super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
               super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl;
      if (pQVar5 != (QMarginsF *)0x0) {
        local_c8.yp = local_c8.yp + pQVar5->m_top;
        local_c8.xp = dVar11 + pQVar5->m_left;
      }
      local_68 = (undefined1 *)
                 CONCAT44(local_68._4_4_,(QFlagsStorageHelper<QStyle::SubControl,_4>)0x8);
      pQVar9 = QGraphicsWidget::style((QGraphicsWidget *)this_00);
      pQVar10 = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
      local_d8 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,5,local_a8,8,pQVar10);
      local_e0 = QPointF::toPoint((QPointF *)&local_c8);
      iVar7 = (int)&local_e0;
      cVar6 = QRect::contains((QPoint *)local_d8,SUB81(&local_e0,0));
      if (cVar6 != '\0') {
        QGraphicsWidget::close((QGraphicsWidget *)this_00,iVar7);
      }
      QStyleOptionTitleBar::~QStyleOptionTitleBar((QStyleOptionTitleBar *)local_a8);
    }
    QVar8.i = (Int)QGraphicsSceneMouseEvent::buttons(event);
    if ((QFlagsStorage<Qt::MouseButton>)QVar8.i == (QFlagsStorage<Qt::MouseButton>)0x0) {
      ((this->windowData)._M_t.
       super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
       ._M_t.
       super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
       .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl)->
      grabbedSection = NoSection;
    }
    (event->super_QGraphicsSceneEvent).field_0xc = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidgetPrivate::windowFrameMouseReleaseEvent(QGraphicsSceneMouseEvent *event)
{
    Q_Q(QGraphicsWidget);
    ensureWindowData();
    if (windowData->grabbedSection != Qt::NoSection) {
        if (windowData->grabbedSection == Qt::TitleBarArea) {
            windowData->buttonSunken = false;
            QStyleOptionTitleBar bar;
            initStyleOptionTitleBar(&bar);
            // make sure that the coordinates (rect and pos) we send to the style are positive.
            bar.rect = q->windowFrameRect().toRect();
            bar.rect.moveTo(0,0);
            bar.rect.setHeight(q->style()->pixelMetric(QStyle::PM_TitleBarHeight, &bar));
            QPointF pos = event->pos();
            if (windowFrameMargins) {
                pos.rx() += windowFrameMargins->left();
                pos.ry() += windowFrameMargins->top();
            }
            bar.subControls = QStyle::SC_TitleBarCloseButton;
            if (q->style()->subControlRect(QStyle::CC_TitleBar, &bar,
                                           QStyle::SC_TitleBarCloseButton,
                                           event->widget()).contains(pos.toPoint())) {
                q->close();
            }
        }
        if (!(static_cast<QGraphicsSceneMouseEvent *>(event)->buttons()))
            windowData->grabbedSection = Qt::NoSection;
        event->accept();
    }
}